

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O0

void unit_mul(void)

{
  unit *puVar1;
  unit *puVar2;
  int i;
  unit *up;
  int local_c;
  
  if (UnitsOn != 0) {
    if (usp < (unit *)((long)&unit_stack[0].factor + 1)) {
      __assert_fail("usp > unit_stack",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/units.c"
                    ,0x127,"void unit_mul()");
    }
    check_num();
    puVar1 = usp;
    puVar2 = usp + -1;
    for (local_c = 0; local_c < 10; local_c = local_c + 1) {
      puVar1->dim[(long)local_c + -0x18] = puVar1->dim[(long)local_c + -0x18] + usp->dim[local_c];
    }
    puVar2->factor = usp->factor * puVar2->factor;
    unit_pop();
  }
  return;
}

Assistant:

void unit_mul() {
	/* multiply next element by top of stack and leave on stack */
	struct unit *up;
	int i;
	
	IFUNITS
	assert(usp > unit_stack);
	check_num();
	up = usp -1;
	for (i=0; i<NDIM; i++) {
		up->dim[i] += usp->dim[i];
	}
	up->factor *= usp->factor;
	unit_pop();
}